

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda_core.cc
# Opt level: O1

float __thiscall lda::powf(lda *this,float __x,float __y)

{
  lda_math_mode lVar1;
  float fVar2;
  ostream *poVar3;
  float fVar4;
  
  lVar1 = this->mmode;
  if (lVar1 != USE_SIMD) {
    if (lVar1 == USE_PRECISE) {
      fVar2 = ::powf(__x,__y);
      return fVar2;
    }
    if (lVar1 != USE_FAST_APPROX) {
      poVar3 = std::operator<<((ostream *)&std::cerr,
                               "lda::powf: Trampled or invalid math mode, aborting");
      std::endl<char,std::char_traits<char>>(poVar3);
      abort();
    }
  }
  fVar2 = (float)((uint)__x & 0x7fffff | 0x3f000000);
  fVar4 = (-1.72588 / (fVar2 + 0.35208872) +
          fVar2 * -1.4980303 + (float)(uint)__x * 1.1920929e-07 + -124.22545) * __y;
  fVar2 = -126.0;
  if (-126.0 <= fVar4) {
    fVar2 = fVar4;
  }
  fVar4 = (fVar2 - (float)(int)fVar2) + (float)(-(uint)(fVar4 < 0.0) & 0x3f800000);
  return (float)(long)((fVar4 * -1.4901291 + 27.728024 / (4.8425255 - fVar4) + fVar2 + 121.274086) *
                      8388608.0);
}

Assistant:

float lda::powf(float x, float p)
{
  switch (mmode)
  {
    case USE_FAST_APPROX:
      // std::cerr << "lda::powf FAST_APPROX ";
      return ldamath::powf<float, USE_FAST_APPROX>(x, p);
    case USE_PRECISE:
      // std::cerr << "lda::powf PRECISE ";
      return ldamath::powf<float, USE_PRECISE>(x, p);
    case USE_SIMD:
      // std::cerr << "lda::powf SIMD ";
      return ldamath::powf<float, USE_SIMD>(x, p);
    default:
      std::cerr << "lda::powf: Trampled or invalid math mode, aborting" << std::endl;
      abort();
      return 0.0f;
  }
}